

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O3

void __thiscall chrono::ChLinkMarkers::ChLinkMarkers(ChLinkMarkers *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [48];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined8 uVar13;
  undefined1 auVar11 [64];
  undefined1 auVar14 [32];
  undefined1 auVar15 [56];
  undefined8 uVar12;
  
  ChLink::ChLink(&this->super_ChLink);
  auVar11 = _DAT_00963c00;
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChPhysicsItem_00b16368;
  this->marker1 = (ChMarker *)0x0;
  this->marker2 = (ChMarker *)0x0;
  this->markID1 = 0;
  this->markID2 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = CSYSNULL;
  auVar8 = vbroadcastsd_avx512f(auVar2);
  auVar9 = vinsertf32x4_avx512f
                     (ZEXT3264(CONCAT1616(CSYSNORM._16_16_,CSYSNORM._0_16_)),CSYSNORM._16_16_,2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = CSYSNORM._48_8_;
  auVar10 = vbroadcastsd_avx512f(auVar3);
  uVar12 = auVar10._48_8_;
  auVar7 = auVar9._0_48_;
  uVar13 = auVar8._56_8_;
  auVar15._48_8_ = uVar12;
  auVar15._0_48_ = auVar7;
  (this->relM).pos = (ChVector<double>)auVar7._0_24_;
  (this->relM).rot = (ChQuaternion<double>)auVar15._24_32_;
  (this->relM_dt).pos.m_data[0] = (double)uVar13;
  auVar5._8_24_ = _DAT_00b68a18;
  auVar5._0_8_ = _DAT_00b68a10;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = DAT_00b68a30;
  auVar9 = vbroadcastsd_avx512f(auVar4);
  auVar11 = vpermi2pd_avx512f(auVar11,ZEXT3264(auVar5),
                              ZEXT1664(CONCAT88(_DAT_00b68a10,_DAT_00b68a08)));
  auVar10._0_40_ = auVar11._0_40_;
  auVar10._40_8_ = auVar9._40_8_;
  auVar10._48_8_ = auVar11._48_8_;
  auVar10._56_8_ = auVar11._56_8_;
  auVar11 = vpermi2pd_avx512f(_DAT_00963c40,auVar10,auVar8);
  *(undefined1 (*) [64])((this->relM_dt).pos.m_data + 1) = auVar11;
  *(undefined1 (*) [32])((this->relM_dtdt).pos.m_data + 2) = auVar5;
  dVar1 = (double)vmovlpd_avx(auVar9._0_16_);
  (this->relM_dtdt).rot.m_data[3] = dVar1;
  auVar11 = _DAT_00963c80;
  this->relAngle = 0.0;
  (this->relAxis).m_data[0] = 0.0;
  (this->relAxis).m_data[1] = 0.0;
  (this->relAxis).m_data[2] = 0.0;
  dVar1 = DAT_00b689a8;
  auVar14._8_8_ = VNULL;
  auVar14._0_8_ = VNULL;
  auVar14._16_8_ = VNULL;
  auVar14._24_8_ = VNULL;
  auVar6._8_8_ = DAT_00b689a8;
  auVar6._0_8_ = DAT_00b689a0;
  auVar11 = vpermi2pd_avx512f(auVar11,ZEXT1664(auVar6),ZEXT3264(auVar14));
  this->relRotaxis = (ChVector<double>)auVar11._0_24_;
  this->relWvel = (ChVector<double>)auVar11._24_24_;
  (this->relWacc).m_data[0] = (double)auVar11._48_8_;
  (this->relWacc).m_data[1] = (double)auVar11._56_8_;
  auVar5 = vpermpd_avx2(ZEXT1632(auVar6),0xd0);
  (this->relWacc).m_data[2] = dVar1;
  auVar5 = vblendpd_avx(auVar14,auVar5,6);
  this->C_force = (ChVector<double>)auVar5._0_24_;
  (this->C_torque).m_data[0] = (double)auVar5._24_8_;
  *(undefined1 (*) [16])((this->C_torque).m_data + 1) = auVar6;
  (this->PQw_dtdt).m_data[2] = 0.0;
  (this->q_AD).m_data[0] = 0.0;
  (this->q_AD).m_data[1] = 0.0;
  (this->q_AD).m_data[2] = 0.0;
  (this->q_AD).m_data[3] = 0.0;
  (this->q_BC).m_data[0] = 0.0;
  (this->q_BC).m_data[1] = 0.0;
  (this->q_BC).m_data[2] = 0.0;
  (this->q_BC).m_data[3] = 0.0;
  (this->q_8).m_data[0] = 0.0;
  (this->q_8).m_data[1] = 0.0;
  (this->q_8).m_data[2] = 0.0;
  (this->q_8).m_data[3] = 0.0;
  (this->q_4).m_data[0] = 0.0;
  (this->q_4).m_data[1] = 0.0;
  (this->q_4).m_data[2] = 0.0;
  (this->PQw).m_data[0] = 0.0;
  (this->PQw).m_data[1] = 0.0;
  (this->PQw).m_data[2] = 0.0;
  (this->PQw_dt).m_data[0] = 0.0;
  (this->PQw_dt).m_data[1] = 0.0;
  (this->PQw_dt).m_data[2] = 0.0;
  (this->PQw_dtdt).m_data[0] = 0.0;
  (this->PQw_dtdt).m_data[1] = 0.0;
  return;
}

Assistant:

ChLinkMarkers::ChLinkMarkers()
    : marker1(NULL),
      marker2(NULL),
      markID1(0),
      markID2(0),
      relM(CSYSNORM),
      relM_dt(CSYSNULL),
      relM_dtdt(CSYSNULL),
      relAngle(0),
      relRotaxis(VNULL),
      relWvel(VNULL),
      relWacc(VNULL),
      C_force(VNULL),
      C_torque(VNULL) {}